

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcStatesStates
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          int *states2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  
  iVar1 = this->kPatternCount;
  uVar2 = this->kCategoryCount;
  iVar3 = this->kPartialsPaddedStateCount;
  for (uVar12 = 0; uVar12 != (~((int)uVar2 >> 0x1f) & uVar2); uVar12 = uVar12 + 1) {
    iVar4 = this->kMatrixSize;
    uVar5 = this->kStateCount;
    iVar13 = (iVar1 * uVar12 + startPattern) * iVar3;
    for (lVar15 = (long)startPattern; lVar15 < endPattern; lVar15 = lVar15 + 1) {
      iVar6 = states1[lVar15];
      iVar7 = states2[lVar15];
      iVar8 = this->kTransPaddedStateCount;
      lVar14 = (long)(int)(iVar4 * uVar12);
      for (lVar11 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != (uint)lVar11; lVar11 = lVar11 + 1) {
        lVar9 = iVar6 + lVar14;
        lVar10 = iVar7 + lVar14;
        lVar14 = lVar14 + iVar8;
        destP[iVar13 + lVar11] = matrices1[lVar9] * matrices2[lVar10];
      }
      iVar13 = iVar13 + (uint)lVar11;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesStates(REALTYPE* destP,
                                                         const int* states1,
                                                         const REALTYPE* matrices1,
                                                         const int* states2,
                                                         const REALTYPE* matrices2,
                                                         int startPattern,
                                                         int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        for (int k = startPattern; k < endPattern; k++) {
            const int state1 = states1[k];
            const int state2 = states2[k];
            if (DEBUGGING_OUTPUT) {
                std::cerr << "calcStatesStates s1 = " << state1 << '\n';
                std::cerr << "calcStatesStates s2 = " << state2 << '\n';
            }
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                destP[v] = matrices1[w + state1] * matrices2[w + state2];
                v++;

                w += kTransPaddedStateCount;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    destP[v] = 0.0;
                    v++;
                }
            }
        }
    }
}